

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O0

void __thiscall mbc::Val::Person::Person(Person *this)

{
  Str *pSVar1;
  VecStr *this_00;
  anon_class_1_0_00000001 local_159;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_158;
  undefined1 local_132;
  anon_class_1_0_00000001 local_131;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_130;
  undefined1 local_10a;
  anon_class_1_0_00000001 local_109;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_108;
  undefined1 local_e2;
  anon_class_1_0_00000001 local_e1;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e0;
  undefined1 local_ba;
  anon_class_1_0_00000001 local_b9;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b8;
  undefined1 local_92;
  anon_class_1_0_00000001 local_91;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  undefined1 local_6a;
  anon_class_1_0_00000001 local_69;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_68;
  undefined1 local_42;
  anon_class_1_0_00000001 local_41;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  Person *local_10;
  Person *this_local;
  
  local_10 = this;
  ValBase::ValBase(&this->super_ValBase);
  (this->super_ValBase)._vptr_ValBase = (_func_int **)&PTR__Person_001927c8;
  *(this->super_ValBase).is_vaild_ = true;
  std::__cxx11::string::operator=
            ((string *)(this->super_ValBase).invaild_waring_,"[invaild person]");
  pSVar1 = (Str *)operator_new(0x38);
  local_42 = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__0,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_40,&local_41);
  Str::Str(pSVar1,&local_40);
  local_42 = 0;
  this->ID_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  pSVar1 = (Str *)operator_new(0x38);
  local_6a = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__1,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_68,&local_69);
  Str::Str(pSVar1,&local_68);
  local_6a = 0;
  this->name_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_68);
  pSVar1 = (Str *)operator_new(0x38);
  local_92 = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__2,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_90,&local_91);
  Str::Str(pSVar1,&local_90);
  local_92 = 0;
  this->sex_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  pSVar1 = (Str *)operator_new(0x38);
  local_ba = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__3,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_b8,&local_b9);
  Str::Str(pSVar1,&local_b8);
  local_ba = 0;
  this->telephone_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b8);
  pSVar1 = (Str *)operator_new(0x38);
  local_e2 = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__4,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_e0,&local_e1);
  Str::Str(pSVar1,&local_e0);
  local_e2 = 0;
  this->mail_number_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_e0);
  pSVar1 = (Str *)operator_new(0x38);
  local_10a = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__5,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_108,&local_109);
  Str::Str(pSVar1,&local_108);
  local_10a = 0;
  this->email_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_108);
  pSVar1 = (Str *)operator_new(0x38);
  local_132 = 1;
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__6,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_130,&local_131);
  Str::Str(pSVar1,&local_130);
  local_132 = 0;
  this->qq_number_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_130);
  pSVar1 = (Str *)operator_new(0x38);
  std::function<bool(std::__cxx11::string_const&)>::function<mbc::Val::Person::Person()::__7,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_158,&local_159);
  Str::Str(pSVar1,&local_158);
  this->location_ = pSVar1;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_158);
  this_00 = (VecStr *)operator_new(0x38);
  VecStr::VecStr(this_00);
  this->classes_ = this_00;
  update_ID_(this);
  return;
}

Assistant:

Person::Person() : ValBase() {
    using namespace units;

    *is_vaild_       = true;
    *invaild_waring_ = "[invaild person]";

    ID_             = new Str([](const string& str){return is_not_empty(str);});
    name_           = new Str([](const string& str){return is_not_empty(str);});
    sex_            = new Str([](const string& str){return str == "M" || str == "F";});
    telephone_      = new Str([](const string& str){return is_digit(str);});
    mail_number_    = new Str([](const string& str){
                            return is_digit(str) && str.size() == 6;
                            });
    email_          = new Str([](const string& str){return is_email(str);});
    qq_number_      = new Str([](const string& str){return is_digit(str);});
    location_       = new Str([](const string& str){return is_not_empty(str);});

    classes_        = new VecStr();

    update_ID_();
}